

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void gl4cts::EnhancedLayouts::Utils::clearPtrVector<gl4cts::EnhancedLayouts::Utils::Interface>
               (vector<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
                *vector)

{
  pointer ppIVar1;
  pointer ppIVar2;
  Interface *this;
  size_t i;
  ulong uVar3;
  
  uVar3 = 0;
  while( true ) {
    ppIVar1 = (vector->
              super__Vector_base<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppIVar2 = (vector->
              super__Vector_base<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppIVar2 - (long)ppIVar1 >> 3) <= uVar3) break;
    this = ppIVar1[uVar3];
    ppIVar1[uVar3] = (Interface *)0x0;
    if (this != (Interface *)0x0) {
      Interface::~Interface(this);
      operator_delete(this,0x40);
    }
    uVar3 = uVar3 + 1;
  }
  if (ppIVar2 != ppIVar1) {
    (vector->
    super__Vector_base<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppIVar1;
  }
  return;
}

Assistant:

void clearPtrVector(std::vector<T*>& vector)
{
	for (size_t i = 0; i < vector.size(); ++i)
	{
		T* t = vector[i];

		vector[i] = 0;

		if (0 != t)
		{
			delete t;
		}
	}

	vector.clear();
}